

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

int Exa_ManMarkup(Exa_Man_t *p)

{
  int iVar1;
  Vec_Wec_t *pVVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int (*paaiVar6) [2] [32];
  int (*paaiVar7) [2] [32];
  ulong uVar8;
  
  iVar3 = p->nObjs;
  if (iVar3 < 0x21) {
    p->iVar = p->nNodes * 3 + 1;
    lVar4 = (long)p->nVars;
    paaiVar6 = p->VarMarks + lVar4;
    for (; lVar4 < iVar3; lVar4 = lVar4 + 1) {
      paaiVar7 = paaiVar6;
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        iVar3 = p->pPars->fFewerVars;
        if (((iVar3 == 0) || (lVar5 != 0)) || (iVar1 = p->nObjs, iVar1 + -1 != (int)lVar4)) {
          uVar8 = 0;
          if (iVar3 != 0) {
            uVar8 = (ulong)(1 - (int)lVar5);
          }
          for (; (long)uVar8 < lVar4 - lVar5; uVar8 = uVar8 + 1) {
            pVVar2 = p->vOutLits;
            iVar3 = Abc_Var2Lit(p->iVar,0);
            Vec_WecPush(pVVar2,(int)uVar8,iVar3);
            iVar3 = p->iVar;
            p->iVar = iVar3 + 1;
            (*paaiVar7)[0][uVar8] = iVar3;
          }
        }
        else {
          pVVar2 = p->vOutLits;
          iVar3 = Abc_Var2Lit(p->iVar,0);
          Vec_WecPush(pVVar2,iVar1 + -2,iVar3);
          iVar3 = p->iVar;
          p->iVar = iVar3 + 1;
          p->VarMarks[lVar4 + -1][1][(long)iVar1 + 0x1e] = iVar3;
        }
        paaiVar7 = (int (*) [2] [32])(*paaiVar7 + 1);
      }
      iVar3 = p->nObjs;
      paaiVar6 = paaiVar6 + 1;
    }
    printf("The number of parameter variables = %d.\n",(ulong)(uint)p->iVar);
    return p->iVar;
  }
  __assert_fail("p->nObjs <= MAJ_NOBJS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                ,0x1c4,"int Exa_ManMarkup(Exa_Man_t *)");
}

Assistant:

int Exa_ManMarkup( Exa_Man_t * p )
{
    int i, k, j;
    assert( p->nObjs <= MAJ_NOBJS );
    // assign functionality
    p->iVar = 1 + p->nNodes * 3;
    // assign connectivity variables
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 2; k++ )
        {
            if ( p->pPars->fFewerVars && i == p->nObjs - 1 && k == 0 )
            {
                j = p->nObjs - 2;
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
                continue;
            }
            for ( j = p->pPars->fFewerVars ? 1 - k : 0; j < i - k; j++ )
            {
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
            }
        }
    }
    printf( "The number of parameter variables = %d.\n", p->iVar );
    return p->iVar;
    // printout
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        printf( "Node %d\n", i );
        for ( j = 0; j < p->nObjs; j++ )
        {
            for ( k = 0; k < 2; k++ )
                printf( "%3d ", p->VarMarks[i][k][j] );
            printf( "\n" );
        }
    }
    return p->iVar;
}